

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O1

Matrix * operator*(Matrix *__return_storage_ptr__,Matrix *lhs,Matrix *rhs)

{
  Fraction *pFVar1;
  Fraction *b;
  invalid_argument *this;
  int i;
  int j;
  int j_00;
  Fraction local_38;
  
  if (lhs->m_ == rhs->n_) {
    i = 0;
    Matrix::Matrix(__return_storage_ptr__,lhs->n_,rhs->m_,0);
    if (0 < __return_storage_ptr__->n_) {
      do {
        if (0 < __return_storage_ptr__->m_) {
          j_00 = 0;
          do {
            if (0 < lhs->m_) {
              j = 0;
              do {
                pFVar1 = Matrix::At(lhs,i,j);
                b = Matrix::At(rhs,j,j_00);
                local_38 = operator*(pFVar1,b);
                pFVar1 = Matrix::At(__return_storage_ptr__,i,j_00);
                Fraction::operator+=(pFVar1,&local_38);
                j = j + 1;
              } while (j < lhs->m_);
            }
            j_00 = j_00 + 1;
          } while (j_00 < __return_storage_ptr__->m_);
        }
        i = i + 1;
      } while (i < __return_storage_ptr__->n_);
    }
    return __return_storage_ptr__;
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,"[MUL] Mismatched number of rows");
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

int Matrix::GetNumColumns() const {
  return m_;
}